

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase::sectionEnded(CumulativeReporterBase *this,SectionStats *sectionStats)

{
  bool bVar1;
  reference this_00;
  SectionNode *pSVar2;
  SectionNode *node;
  SectionStats *sectionStats_local;
  CumulativeReporterBase *this_local;
  
  bVar1 = std::
          vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
          ::empty(&this->m_sectionStack);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_sectionStack.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/schenker[P]RegionDetector/tests/catch.hpp"
                  ,0x223e,
                  "virtual void Catch::CumulativeReporterBase::sectionEnded(const SectionStats &)");
  }
  this_00 = std::
            vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
            ::back(&this->m_sectionStack);
  pSVar2 = Ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(this_00);
  SectionStats::operator=(&pSVar2->stats,sectionStats);
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
  ::pop_back(&this->m_sectionStack);
  return;
}

Assistant:

virtual void sectionEnded(SectionStats const& sectionStats) CATCH_OVERRIDE {
			assert(!m_sectionStack.empty());
			SectionNode& node = *m_sectionStack.back();
			node.stats = sectionStats;
			m_sectionStack.pop_back();
		}